

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressdialog.cpp
# Opt level: O3

void QProgressDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  long lVar2;
  QProgressDialogPrivate *this;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  undefined1 uVar6;
  int iVar7;
  QString *pQVar8;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
        return;
      }
      break;
    case 1:
      lVar2 = *(long *)(_o + 8);
      *(undefined1 *)(lVar2 + 0x34c) = 1;
      reset((QProgressDialog *)_o);
      *(undefined2 *)(lVar2 + 0x34c) = 0x100;
      goto switchD_005085d2_caseD_3;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        reset((QProgressDialog *)_o);
        return;
      }
      break;
    case 3:
      iVar7 = *_a[1];
LAB_0050881a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressBar::setMaximum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),iVar7);
        return;
      }
      break;
    case 4:
      iVar7 = *_a[1];
LAB_005087a3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressBar::setMinimum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),iVar7);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressBar::setRange(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),*_a[1],*_a[2]);
        return;
      }
      break;
    case 6:
      iVar7 = *_a[1];
LAB_005088c4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setValue((QProgressDialog *)_o,iVar7);
        return;
      }
      break;
    case 7:
      pQVar8 = (QString *)_a[1];
switchD_00508638_caseD_7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setLabelText((QProgressDialog *)_o,pQVar8);
        return;
      }
      break;
    case 8:
      pQVar8 = (QString *)_a[1];
      this = *(QProgressDialogPrivate **)(_o + 8);
      this->useDefaultCancelText = false;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressDialogPrivate::setCancelButtonText(this,pQVar8);
        return;
      }
      break;
    case 9:
      iVar7 = *_a[1];
LAB_005087d4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumDuration((QProgressDialog *)_o,iVar7);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        forceShow((QProgressDialog *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressDialogPrivate::_q_disconnectOnClose(*(QProgressDialogPrivate **)(_o + 8));
        return;
      }
      break;
    default:
      goto switchD_005085d2_caseD_3;
    }
    goto LAB_0050897f;
  case ReadProperty:
    if (7 < (uint)_id) break;
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x34d);
      goto LAB_0050874b;
    case 1:
      iVar7 = QProgressBar::minimum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0));
      break;
    case 2:
      iVar7 = QProgressBar::maximum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0));
      break;
    case 3:
      iVar7 = QProgressBar::value(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0));
      break;
    case 4:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x34b);
      goto LAB_0050874b;
    case 5:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x34a);
LAB_0050874b:
      *(undefined1 *)piVar1 = uVar6;
      goto switchD_005085d2_caseD_3;
    case 6:
      iVar7 = *(int *)(*(long *)(_o + 8) + 0x340);
      break;
    case 7:
      if (*(QLabel **)(*(long *)(_o + 8) + 0x2e0) == (QLabel *)0x0) {
        local_38.d.d._0_4_ = 0;
        local_38.d.d._4_4_ = 0;
        local_38.d.ptr._0_4_ = 0;
        local_38.d.ptr._4_4_ = 0;
        local_38.d.size = 0;
      }
      else {
        QLabel::text(&local_38,*(QLabel **)(*(long *)(_o + 8) + 0x2e0));
      }
      pQVar3 = *(QArrayData **)piVar1;
      pcVar4 = *(char16_t **)(piVar1 + 2);
      *piVar1 = (int)local_38.d.d;
      piVar1[1] = local_38.d.d._4_4_;
      piVar1[2] = (int)local_38.d.ptr;
      piVar1[3] = local_38.d.ptr._4_4_;
      qVar5 = *(qsizetype *)(piVar1 + 4);
      *(qsizetype *)(piVar1 + 4) = local_38.d.size;
      local_38.d.d = (Data *)pQVar3;
      local_38.d.ptr = pcVar4;
      local_38.d.size = qVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      goto switchD_005085d2_caseD_3;
    }
    *piVar1 = iVar7;
    break;
  case WriteProperty:
    if (_id - 1U < 7) {
      pQVar8 = (QString *)*_a;
      switch(_id) {
      case 1:
        iVar7 = *(int *)&(pQVar8->d).d;
        goto LAB_005087a3;
      case 2:
        iVar7 = *(int *)&(pQVar8->d).d;
        goto LAB_0050881a;
      case 3:
        iVar7 = *(int *)&(pQVar8->d).d;
        goto LAB_005088c4;
      case 4:
        *(undefined1 *)(*(long *)(_o + 8) + 0x34b) = *(undefined1 *)&(pQVar8->d).d;
        break;
      case 5:
        *(undefined1 *)(*(long *)(_o + 8) + 0x34a) = *(undefined1 *)&(pQVar8->d).d;
        break;
      case 6:
        iVar7 = *(int *)&(pQVar8->d).d;
        goto LAB_005087d4;
      case 7:
        goto switchD_00508638_caseD_7;
      }
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == canceled) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
switchD_005085d2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0050897f:
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->canceled(); break;
        case 1: _t->cancel(); break;
        case 2: _t->reset(); break;
        case 3: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setLabelText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setCancelButtonText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setMinimumDuration((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->forceShow(); break;
        case 11: _t->d_func()->_q_disconnectOnClose(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressDialog::*)()>(_a, &QProgressDialog::canceled, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wasCanceled(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->autoReset(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->autoClose(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->minimumDuration(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->labelText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAutoReset(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setAutoClose(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMinimumDuration(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setLabelText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}